

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadLane<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  unsigned_short *puVar2;
  unsigned_short local_32;
  undefined1 auStack_30 [6];
  T val;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = out_trap;
  _auStack_30 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  RVar1 = Load<unsigned_short>(this,instr,&local_32,(Ptr *)result.v._8_8_);
  if (RVar1 == Ok) {
    puVar2 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_30,
                        instr.field_2.imm_u32x2_u8.idx);
    *puVar2 = local_32;
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,_auStack_30);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  auto result = Pop<S>();
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  result[instr.imm_u32x2_u8.idx] = val;
  Push(result);
  return RunResult::Ok;
}